

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O0

int __thiscall
sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::init
          (BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_> *this,
          EVP_PKEY_CTX *ctx)

{
  DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
  *pDVar1;
  BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_> *extraout_RAX;
  byte in_CL;
  uint in_EDX;
  undefined4 in_stack_ffffffffffffff94;
  uint cache_size;
  string *in_stack_ffffffffffffff98;
  DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
  *in_stack_ffffffffffffffa0;
  string local_38 [35];
  byte local_15;
  uint local_14;
  EVP_PKEY_CTX *local_10;
  BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_> *local_8;
  
  local_15 = in_CL & 1;
  local_10 = ctx;
  local_8 = this;
  if (local_15 == 0) {
    pDVar1 = (DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
              *)operator_new(0x228);
    cache_size = CONCAT13(1,(int3)in_stack_ffffffffffffff94);
    std::__cxx11::string::string((string *)&stack0xffffffffffffff98,(string *)ctx);
    DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
    ::DynamicFileManager(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,cache_size);
    this->file = pDVar1;
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
    if (((this->file->
         super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
         ).is_newfile & 1U) == 0) {
      getfromcache((BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>
                    *)ctx);
      this = extraout_RAX;
    }
    else {
      (*(this->file->
        super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
        )._vptr_FileManager_Base[1])();
      this->root = -1;
      this->depth = 0;
      this->siz = 0;
    }
  }
  else {
    pDVar1 = this->file;
    local_14 = in_EDX;
    std::__cxx11::string::string(local_38,(string *)ctx);
    (**(pDVar1->
       super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
       )._vptr_FileManager_Base)(pDVar1,local_38,(ulong)local_14,1);
    std::__cxx11::string::~string(local_38);
    this->root = -1;
    this->depth = 0;
    this->siz = 0;
  }
  return (int)this;
}

Assistant:

void init(std::string str , unsigned int cache_size , bool is_reset = false)
        {
            if (is_reset) {
                file->init(str, cache_size , true);
                root = -1,depth = 0,siz=0;
            } else {
                file = new DynamicFileManager<node>(str , cache_size);
                if (file->is_newfile)
		{
                	file->newspace();
			root = - 1 , depth = 0 , siz = 0;
		}
                else
                    getfromcache();
            }
        }